

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffdt2s(int year,int month,int day,char *datestr,int *status)

{
  int iVar1;
  int *status_local;
  char *datestr_local;
  int day_local;
  int month_local;
  int year_local;
  
  if (*status < 1) {
    *datestr = '\0';
    iVar1 = ffverifydate(year,month,day,status);
    if (iVar1 < 1) {
      if ((year < 0x76c) || (0x7ce < year)) {
        sprintf(datestr,"%.4d-%.2d-%.2d",(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)day);
      }
      else {
        sprintf(datestr,"%.2d/%.2d/%.2d",(ulong)(uint)day,(ulong)(uint)month,(ulong)(year - 0x76c));
      }
      month_local = *status;
    }
    else {
      ffpmsg("invalid date (ffdt2s)");
      month_local = *status;
    }
  }
  else {
    month_local = *status;
  }
  return month_local;
}

Assistant:

int ffdt2s(int year,          /* I - year (0 - 9999)           */
           int month,         /* I - month (1 - 12)            */
           int day,           /* I - day (1 - 31)              */
           char *datestr,     /* O - date string: "YYYY-MM-DD" */
           int   *status)     /* IO - error status             */
/*
  Construct a date character string
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datestr = '\0';
    
    if (ffverifydate(year, month, day, status) > 0)
    {
        ffpmsg("invalid date (ffdt2s)");
        return(*status);
    }

    if (year >= 1900 && year <= 1998)  /* use old 'dd/mm/yy' format */
        sprintf(datestr, "%.2d/%.2d/%.2d", day, month, year - 1900);

    else  /* use the new 'YYYY-MM-DD' format */
        sprintf(datestr, "%.4d-%.2d-%.2d", year, month, day);

    return(*status);
}